

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,char element)

{
  undefined8 in_RAX;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  Align(this,1);
  uStack_18 = CONCAT17(element,(undefined7)uStack_18);
  vector_downward<unsigned_int>::push_small<signed_char>(&this->buf_,(char *)((long)&uStack_18 + 7))
  ;
  return (this->buf_).size_;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }